

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall Sonne::Config::Write(Config *this,string *path)

{
  json configObject;
  ofstream out;
  undefined8 auStack_1f8 [62];
  
  _ConstructConfigJSON_abi_cxx11_((Config *)&configObject);
  std::ofstream::ofstream(&out,(string *)path,_S_out);
  *(undefined8 *)((long)auStack_1f8 + (long)_out[-1]._M_parent) = 4;
  nlohmann::operator<<((ostream *)&out,&configObject);
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&configObject);
  return;
}

Assistant:

void Config::Write(const std::string& path)
{
    nlohmann::json configObject = _ConstructConfigJSON();

    std::ofstream out(path);

    out << std::setw(4) << configObject;

    out.close();
}